

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.h
# Opt level: O0

bool __thiscall IR::PropertySymOpnd::NeedsWriteGuardTypeCheck(PropertySymOpnd *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  byte local_19;
  PropertySymOpnd *this_local;
  
  bVar2 = MayNeedTypeCheckProtection(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x46a,"(MayNeedTypeCheckProtection())","MayNeedTypeCheckProtection()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = TypeCheckSeqBitsSetOnlyIfCandidate(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.h"
                       ,0x46b,"(TypeCheckSeqBitsSetOnlyIfCandidate())",
                       "TypeCheckSeqBitsSetOnlyIfCandidate()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsTypeCheckOnly(this);
  local_19 = 0;
  if (!bVar2) {
    bVar2 = NeedsPrimaryTypeCheck(this);
    local_19 = 0;
    if (!bVar2) {
      bVar2 = IsTypeChecked(this);
      local_19 = 0;
      if (bVar2) {
        bVar2 = IsWriteGuardChecked(this);
        local_19 = bVar2 ^ 0xff;
      }
    }
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool NeedsWriteGuardTypeCheck() const
    {
        Assert(MayNeedTypeCheckProtection());
        Assert(TypeCheckSeqBitsSetOnlyIfCandidate());
        // Type has been checked but property might have been written to since then.
        return !IsTypeCheckOnly() && !NeedsPrimaryTypeCheck() && IsTypeChecked() && !IsWriteGuardChecked();
    }